

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::comptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  StructT *pSVar1;
  string local_d0;
  undefined1 local_b0 [8];
  MaybeResult<wasm::Signature> _val;
  __index_type local_80;
  string local_78 [32];
  undefined1 local_58 [8];
  MaybeResult<wasm::Signature> type;
  __index_type local_28;
  
  functype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Signature> *)local_58,ctx);
  if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)local_58);
    conttype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Continuation> *)local_58,ctx);
    if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01')
    {
      std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                        local_58);
      structtype<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>_>
                  *)local_58,ctx);
      if (local_28 == '\x01') {
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                             *)local_58);
        arraytype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Array> *)local_58,ctx);
        if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ ==
            '\x01') {
          std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)local_58)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"expected type description",(allocator<char> *)local_b0);
          Lexer::err((Err *)local_58,&ctx->in,&local_d0);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
          std::__cxx11::string::~string((string *)local_58);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)local_b0,
                          (_Copy_ctor_base<false,_wasm::Array,_wasm::None,_wasm::Err> *)local_58);
          if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ ==
              '\x02') {
            std::__cxx11::string::string(local_78,(string *)local_b0);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_78
                      );
            std::__cxx11::string::~string(local_78);
            std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)
                              local_b0);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)
                              local_b0);
            pSVar1 = (StructT *)0x0;
            if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                '\0') {
              pSVar1 = (StructT *)local_58;
            }
            ParseTypeDefsCtx::addArrayType(ctx,(ArrayT *)pSVar1);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Array,_wasm::None,_wasm::Err> *)local_58)
          ;
        }
      }
      else {
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                           *)local_b0,
                          (_Copy_ctor_base<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                           *)local_58);
        if (local_80 == '\x02') {
          std::__cxx11::string::string(local_78,(string *)local_b0);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_78);
          std::__cxx11::string::~string(local_78);
          std::__detail::__variant::
          _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                               *)local_b0);
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                               *)local_b0);
          pSVar1 = (StructT *)0x0;
          if (local_28 == '\0') {
            pSVar1 = (StructT *)local_58;
          }
          ParseTypeDefsCtx::addStructType(ctx,pSVar1);
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>,_wasm::None,_wasm::Err>
                             *)local_58);
      }
    }
    else {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)local_b0,
                      (_Copy_ctor_base<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)local_58)
      ;
      if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02'
         ) {
        std::__cxx11::string::string(local_78,(string *)local_b0);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_78);
        std::__cxx11::string::~string(local_78);
        std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                            local_b0);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                            local_b0);
        pSVar1 = (StructT *)0x0;
        if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0'
           ) {
          pSVar1 = (StructT *)local_58;
        }
        ParseTypeDefsCtx::addContType(ctx,(ContinuationT *)pSVar1);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Continuation,_wasm::None,_wasm::Err> *)
                        local_58);
    }
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)local_b0,
                    (_Copy_ctor_base<false,_wasm::Signature,_wasm::None,_wasm::Err> *)local_58);
    if (_val.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
    {
      std::__cxx11::string::string(local_78,(string *)local_b0);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_78);
      std::__cxx11::string::~string(local_78);
      std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)local_b0)
      ;
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)local_b0)
      ;
      pSVar1 = (StructT *)0x0;
      if (type.val.super__Variant_base<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Signature,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Signature,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0')
      {
        pSVar1 = (StructT *)local_58;
      }
      ParseTypeDefsCtx::addFuncType(ctx,(SignatureT *)pSVar1);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Signature,_wasm::None,_wasm::Err> *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> comptype(Ctx& ctx) {
  if (auto type = functype(ctx)) {
    CHECK_ERR(type);
    ctx.addFuncType(*type);
    return Ok{};
  }
  if (auto type = conttype(ctx)) {
    CHECK_ERR(type);
    ctx.addContType(*type);
    return Ok{};
  }
  if (auto type = structtype(ctx)) {
    CHECK_ERR(type);
    ctx.addStructType(*type);
    return Ok{};
  }
  if (auto type = arraytype(ctx)) {
    CHECK_ERR(type);
    ctx.addArrayType(*type);
    return Ok{};
  }
  return ctx.in.err("expected type description");
}